

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StandardChars.h
# Opt level: O0

void __thiscall
UnifiedRegex::CaseMapper<UnifiedRegex::CaseMapper<UnifiedRegex::TrivialCaseMapper>_>::CaseMapper
          (CaseMapper<UnifiedRegex::CaseMapper<UnifiedRegex::TrivialCaseMapper>_> *this,
          ArenaAllocator *allocator,MappingSource mappingSource,
          CaseMapper<UnifiedRegex::TrivialCaseMapper> *fallbackMapper)

{
  Char CVar1;
  uint uVar2;
  uint uVar3;
  int local_54;
  ulong uStack_50;
  int i;
  uint64 r;
  bool isNonTrivial;
  char16 equivl [4];
  uint acth;
  uint tblidx;
  uint h;
  uint l;
  uint maxUChar;
  CaseMapper<UnifiedRegex::TrivialCaseMapper> *fallbackMapper_local;
  MappingSource mappingSource_local;
  ArenaAllocator *allocator_local;
  CaseMapper<UnifiedRegex::CaseMapper<UnifiedRegex::TrivialCaseMapper>_> *this_local;
  
  CharMap<char16_t,_unsigned_long,_(UnifiedRegex::CharMapScheme)1>::CharMap
            (&this->toEquivs,0xffffffffffffffff);
  this->fallbackMapper = fallbackMapper;
  tblidx = 0;
  equivl[2] = L'\0';
  equivl[3] = L'\0';
  do {
    r._3_1_ = CaseInsensitive::RangeToEquivClassOnlyInSource
                        (mappingSource,(uint *)(equivl + 2),tblidx,0xffff,(uint *)equivl,
                         (char16 *)((long)&r + 4));
    if ((bool)r._3_1_) {
      do {
        uStack_50 = 0;
        for (local_54 = 3; -1 < local_54; local_54 = local_54 + -1) {
          CVar1 = *(Char *)((long)&r + (long)local_54 * 2 + 4);
          *(Char *)((long)&r + (long)local_54 * 2 + 4) = CVar1 + L'\x01';
          uVar2 = Chars<char16_t>::CTU(CVar1);
          uStack_50 = (ulong)uVar2 | uStack_50 << 0x10;
        }
        uVar3 = tblidx + 1;
        CVar1 = Chars<char16_t>::UTC(tblidx);
        CharMap<char16_t,_unsigned_long,_(UnifiedRegex::CharMapScheme)1>::Set
                  (&this->toEquivs,allocator,CVar1,uStack_50);
        tblidx = uVar3;
      } while (uVar3 <= (uint)equivl._0_4_);
    }
    else {
      tblidx = equivl._0_4_ + 1;
    }
  } while (tblidx < 0x10000);
  return;
}

Assistant:

CaseMapper(ArenaAllocator *allocator, CaseInsensitive::MappingSource mappingSource, const FallbackCaseMapper *fallbackMapper) :
            toEquivs((uint64) -1),
            fallbackMapper(fallbackMapper)
        {
            CompileAssert(sizeof(char16) == 2);
            CompileAssert(sizeof(uint) > sizeof(char16));

            const uint maxUChar = Chars<char16>::MaxUChar;
            uint l = 0;
            uint h = maxUChar;
            uint tblidx = 0;
            do {
                uint acth;
                char16 equivl[CaseInsensitive::EquivClassSize];
                bool isNonTrivial = CaseInsensitive::RangeToEquivClassOnlyInSource(mappingSource, tblidx, l, h, acth, equivl);
                if (isNonTrivial)
                {
                    __assume(acth <= maxUChar); // property of algorithm: acth never greater than h
                    do
                    {
                        uint64 r = 0;
                        CompileAssert(sizeof(r) >= sizeof(char16) * CaseInsensitive::EquivClassSize);

                        for (int i = CaseInsensitive::EquivClassSize - 1; i >= 0; i--)
                        {
                            __assume(equivl[i] <= maxUChar); // property of algorithm: never map outside of range
                            r <<= 16;
                            r |= Chars<char16>::CTU(equivl[i]++);
                        }
                        toEquivs.Set(allocator, Chars<char16>::UTC(l++), r);
                    }
                    while (l <= acth);
                }
                else
                {
                    l = acth + 1;
                }
            }
            while (l <= h);
        }